

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.c
# Opt level: O3

int libssh2_session_handshake(LIBSSH2_SESSION *session,libssh2_socket_t sock)

{
  uchar uVar1;
  uchar *puVar2;
  uint uVar3;
  int iVar4;
  uint32_t uVar5;
  time_t tVar6;
  ssize_t sVar7;
  size_t sVar8;
  char *pcVar9;
  ulong banner_len;
  char local_71;
  time_t local_70;
  libssh2_socket_t local_64;
  uchar *local_60;
  uchar *local_58;
  key_exchange_state_t *local_50;
  packet_require_state_t *local_48;
  uchar **local_40;
  uchar *local_38;
  
  local_64 = sock;
  tVar6 = time((time_t *)0x0);
  local_50 = &session->startup_key_state;
  local_38 = session->startup_service;
  local_58 = session->startup_service + 1;
  local_60 = session->startup_service + 5;
  local_40 = &session->startup_data;
  local_48 = &session->startup_req_state;
  local_70 = tVar6;
LAB_0010673d:
  iVar4 = -0x22;
  switch(session->startup_state) {
  case libssh2_NB_state_idle:
    if (local_64 != -1) {
      session->socket_fd = local_64;
      uVar3 = fcntl(local_64,3,0);
      uVar3 = uVar3 >> 0xb & 1;
      session->socket_prev_blockstate = uVar3 ^ 1;
      if (uVar3 == 0) {
        iVar4 = session->socket_fd;
        uVar3 = fcntl(iVar4,3,0);
        tVar6 = local_70;
        iVar4 = fcntl(iVar4,4,(ulong)(uVar3 | 0x800));
        if (iVar4 != 0) {
          pcVar9 = "Failed changing socket\'s blocking state to non-blocking";
          goto LAB_00106c15;
        }
      }
      session->startup_state = libssh2_NB_state_created;
      goto switchD_00106760_caseD_2;
    }
    iVar4 = -0x2d;
    pcVar9 = "Bad socket provided";
    goto LAB_00106c15;
  default:
    goto switchD_00106760_caseD_1;
  case libssh2_NB_state_created:
switchD_00106760_caseD_2:
    sVar8 = 0x1c;
    pcVar9 = "SSH-2.0-libssh2_1.11.1_DEV\r\n";
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      pcVar9 = (char *)(session->local).banner;
      if ((uchar *)pcVar9 == (uchar *)0x0) {
        pcVar9 = "SSH-2.0-libssh2_1.11.1_DEV\r\n";
      }
      else {
        sVar8 = strlen(pcVar9);
      }
      session->banner_TxRx_state = libssh2_NB_state_created;
    }
    *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfd;
    sVar7 = (*session->send)(session->socket_fd,(uchar *)pcVar9 + session->banner_TxRx_total_send,
                             sVar8 - session->banner_TxRx_total_send,
                             (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
    tVar6 = local_70;
    if (sVar7 == sVar8 - session->banner_TxRx_total_send) {
      session->banner_TxRx_total_send = 0;
      session->startup_state = libssh2_NB_state_sent;
      session->banner_TxRx_state = libssh2_NB_state_idle;
      break;
    }
    if (sVar7 < 0 && sVar7 != -0xb) {
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
      iVar4 = -0x2b;
      pcVar9 = "Failed sending banner";
      goto LAB_00106c15;
    }
    session->socket_block_directions = 2;
    if (0 < sVar7) {
      session->banner_TxRx_total_send = session->banner_TxRx_total_send + sVar7;
    }
    goto LAB_00106c23;
  case libssh2_NB_state_sent:
    break;
  case libssh2_NB_state_sent1:
    goto switchD_00106760_caseD_4;
  case libssh2_NB_state_sent2:
    goto switchD_00106760_caseD_5;
  case libssh2_NB_state_sent3:
    goto switchD_00106760_caseD_6;
  case libssh2_NB_state_sent4:
    goto switchD_00106760_caseD_7;
  }
  do {
    if (session->banner_TxRx_state == libssh2_NB_state_idle) {
      puVar2 = (session->remote).banner;
      if (puVar2 != (uchar *)0x0) {
        (*session->free)(puVar2,&session->abstract);
      }
      (session->remote).banner = (uchar *)0x0;
      session->banner_TxRx_state = libssh2_NB_state_created;
      banner_len = 0;
    }
    else {
      banner_len = session->banner_TxRx_total_send;
    }
LAB_001068e6:
    do {
      local_71 = '\0';
      *(byte *)&session->socket_block_directions = (byte)session->socket_block_directions & 0xfe;
      sVar7 = (*session->recv)(session->socket_fd,&local_71,1,
                               (uint)((session->flag).sigpipe == 0) << 0xe,&session->abstract);
      if (sVar7 < 0) {
        if (sVar7 == -0xb) {
          session->socket_block_directions = 1;
          session->banner_TxRx_total_send = banner_len;
          iVar4 = -0x25;
        }
        else {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar4 = -0x2b;
        }
        goto LAB_00106a55;
      }
      if (sVar7 == 0) {
        session->socket_state = -1;
        iVar4 = -0xd;
        goto LAB_00106a55;
      }
      if (banner_len == 0 && (local_71 == '\n' || local_71 == '\r')) {
        banner_len = 0;
        if ((session->remote).banner == (uchar *)0x0) goto LAB_001068e6;
      }
      else {
        if (local_71 == '\0') {
          session->banner_TxRx_state = libssh2_NB_state_idle;
          session->banner_TxRx_total_send = 0;
          iVar4 = -2;
          goto LAB_00106a55;
        }
        if (0xff < banner_len) {
          iVar4 = collect_remote_banner(session,banner_len);
          if (iVar4 < 0) goto LAB_00106a55;
          banner_len = 0;
        }
      }
      session->banner_TxRx_banner[banner_len] = local_71;
      banner_len = banner_len + 1;
    } while (local_71 != '\n');
    iVar4 = collect_remote_banner(session,banner_len);
    if (-1 < iVar4) {
      sVar8 = strlen((char *)(session->remote).banner);
      iVar4 = -2;
      for (; sVar8 != 0; sVar8 = sVar8 - 1) {
        puVar2 = (session->remote).banner;
        uVar1 = puVar2[sVar8 - 1];
        if ((uVar1 != '\r') && (uVar1 != '\n')) {
          iVar4 = 0;
          break;
        }
        puVar2[sVar8 - 1] = '\0';
      }
      session->banner_TxRx_state = libssh2_NB_state_idle;
      session->banner_TxRx_total_send = 0;
    }
LAB_00106a55:
    if (iVar4 != 0) {
      if (iVar4 == -0x25) goto LAB_00106c23;
      pcVar9 = "Failed getting banner";
      goto LAB_00106c15;
    }
    iVar4 = strncmp("SSH-",(char *)(session->remote).banner,4);
  } while (iVar4 != 0);
  session->startup_state = libssh2_NB_state_sent1;
switchD_00106760_caseD_4:
  iVar4 = _libssh2_kex_exchange(session,0,local_50);
  if (iVar4 != -0x25) {
    if (iVar4 != 0) {
      pcVar9 = "Unable to exchange encryption keys";
      goto LAB_00106c15;
    }
    session->startup_state = libssh2_NB_state_sent2;
switchD_00106760_caseD_5:
    session->startup_service[0] = '\x05';
    _libssh2_htonu32(local_58,0xc);
    builtin_memcpy(local_60,"ssh-userauth",0xc);
    session->startup_state = libssh2_NB_state_sent3;
switchD_00106760_caseD_6:
    iVar4 = _libssh2_transport_send(session,local_38,0x11,(uchar *)0x0,0);
    if (iVar4 == -0x25) goto LAB_00106c23;
    if (iVar4 == 0) {
      session->startup_state = libssh2_NB_state_sent4;
switchD_00106760_caseD_7:
      iVar4 = _libssh2_packet_require
                        (session,'\x06',local_40,&session->startup_data_len,0,(uchar *)0x0,0,
                         local_48);
      if (iVar4 != 0) {
        pcVar9 = "Failed to get response to ssh-userauth request";
        goto LAB_00106c15;
      }
      if (session->startup_data_len < 5) {
        iVar4 = -0xe;
        pcVar9 = "Unexpected packet length";
        goto LAB_00106c15;
      }
      uVar5 = _libssh2_ntohu32(session->startup_data + 1);
      session->startup_service_length = (ulong)uVar5;
      puVar2 = session->startup_data;
      if ((uVar5 == 0xc) && (iVar4 = strncmp("ssh-userauth",(char *)(puVar2 + 5),0xc), iVar4 == 0))
      {
        (*session->free)(puVar2,&session->abstract);
        session->startup_data = (uchar *)0x0;
        session->startup_state = libssh2_NB_state_idle;
        return 0;
      }
      (*session->free)(puVar2,&session->abstract);
      session->startup_data = (uchar *)0x0;
      iVar4 = _libssh2_error(session,-0xe,"Invalid response received from server");
      tVar6 = local_70;
    }
    else {
      pcVar9 = "Unable to ask for ssh-userauth service";
LAB_00106c15:
      iVar4 = _libssh2_error(session,iVar4,pcVar9);
    }
    if (iVar4 != -0x25) {
      return iVar4;
    }
  }
LAB_00106c23:
  if (session->api_block_mode == 0) {
    return -0x25;
  }
  iVar4 = _libssh2_wait_socket(session,tVar6);
  if (iVar4 != 0) {
switchD_00106760_caseD_1:
    return iVar4;
  }
  goto LAB_0010673d;
}

Assistant:

LIBSSH2_API int
libssh2_session_handshake(LIBSSH2_SESSION *session, libssh2_socket_t sock)
{
    int rc;

    BLOCK_ADJUST(rc, session, session_startup(session, sock));

    return rc;
}